

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall Js::InterpreterStackFrame::PopOut(InterpreterStackFrame *this,ArgSlot argCount)

{
  InterpreterStackFrame *pIVar1;
  code *pcVar2;
  bool bVar3;
  RegSlot RVar4;
  RegSlot RVar5;
  undefined4 *puVar6;
  undefined8 *puVar7;
  ushort local_22 [4];
  ArgSlot argCount_local;
  
  local_22[0] = argCount;
  UInt16Math::Inc(local_22);
  puVar7 = (undefined8 *)(*(long *)(this + 0x30) + (ulong)local_22[0] * -8);
  *(undefined8 **)(this + 0x30) = puVar7;
  *(undefined8 *)(this + 0x28) = *puVar7;
  RVar4 = FunctionBody::GetLocalsCount(*(FunctionBody **)(this + 0x88));
  pIVar1 = *(InterpreterStackFrame **)(this + 0x30);
  if (this + (ulong)RVar4 * 8 + 0x160 <= pIVar1) {
    RVar4 = FunctionBody::GetLocalsCount(*(FunctionBody **)(this + 0x88));
    RVar5 = FunctionBody::GetOutParamMaxDepth(*(FunctionBody **)(this + 0x88));
    if (pIVar1 < this + (ulong)RVar5 * 8 + (ulong)RVar4 * 8 + 0x160) {
      return;
    }
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  *puVar6 = 1;
  bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                              ,0x9ac,
                              "(m_localSlots + this->m_functionBody->GetLocalsCount() <= m_outSp && m_outSp < (m_localSlots + this->m_functionBody->GetLocalsCount() + this->m_functionBody->GetOutParamMaxDepth()))"
                              ,"out args Stack pointer not in range after Pop");
  if (bVar3) {
    *puVar6 = 0;
    return;
  }
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

inline void InterpreterStackFrame::PopOut(ArgSlot argCount)
    {
        ArgSlotMath::Inc(argCount);
        m_outSp -= argCount;
        m_outParams = (Var*)*m_outSp;

        AssertMsg(m_localSlots + this->m_functionBody->GetLocalsCount() <= m_outSp &&
            m_outSp < (m_localSlots + this->m_functionBody->GetLocalsCount() + this->m_functionBody->GetOutParamMaxDepth()),
            "out args Stack pointer not in range after Pop");
    }